

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.hpp
# Opt level: O2

void __thiscall
diligent_spirv_cross::CompilerGLSL::
statement<char_const(&)[13],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],unsigned_int,char_const(&)[3]>
          (CompilerGLSL *this,char (*ts) [13],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1,char (*ts_2) [3],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_3,char (*ts_4) [3],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_5,char (*ts_6) [3],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_7,char (*ts_8) [3],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_9,char (*ts_10) [3],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_11,char (*ts_12) [3]
          ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_13,
          char (*ts_14) [3],basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_15
          ,char (*ts_16) [3],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_17,char (*ts_18) [3]
          ,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_19,
          char (*ts_20) [3],uint *ts_21,char (*ts_22) [3])

{
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_00;
  bool bVar1;
  uint32_t i;
  uint uVar2;
  string local_50;
  
  bVar1 = Compiler::is_forcing_recompilation(&this->super_Compiler);
  if (!bVar1) {
    this_00 = this->redirect_statement;
    if (this_00 ==
        (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
         *)0x0) {
      for (uVar2 = 0; uVar2 < this->indent; uVar2 = uVar2 + 1) {
        StringStream<4096UL,_4096UL>::operator<<(&this->buffer,"    ");
      }
      statement_inner<char_const(&)[13],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],unsigned_int,char_const(&)[3]>
                (this,ts,ts_1,ts_2,ts_3,ts_4,ts_5,ts_6,ts_7,ts_8,ts_9,ts_10,ts_11,ts_12,ts_13,ts_14,
                 ts_15,ts_16,ts_17,ts_18,ts_19,ts_20,ts_21,ts_22);
      StringStream<4096UL,_4096UL>::operator<<(&this->buffer,'\n');
      return;
    }
    join<char_const(&)[13],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],std::__cxx11::string,char_const(&)[3],unsigned_int,char_const(&)[3]>
              (&local_50,(diligent_spirv_cross *)ts,(char (*) [13])ts_1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_2,
               (char (*) [3])ts_3,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_4,
               (char (*) [3])ts_5,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_6,
               (char (*) [3])ts_7,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_8,
               (char (*) [3])ts_9,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_10,
               (char (*) [3])ts_11,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_12,
               (char (*) [3])ts_13,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_14,
               (char (*) [3])ts_15,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_16,
               (char (*) [3])ts_17,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_18,
               (char (*) [3])ts_19,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ts_20,
               (char (*) [3])ts_21,(uint *)ts_22,(char (*) [3])ts_7);
    SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
    ::push_back(this_00,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  this->statement_count = this->statement_count + 1;
  return;
}

Assistant:

inline void statement(Ts &&... ts)
	{
		if (is_forcing_recompilation())
		{
			// Do not bother emitting code while force_recompile is active.
			// We will compile again.
			statement_count++;
			return;
		}

		if (redirect_statement)
		{
			redirect_statement->push_back(join(std::forward<Ts>(ts)...));
			statement_count++;
		}
		else
		{
			for (uint32_t i = 0; i < indent; i++)
				buffer << "    ";
			statement_inner(std::forward<Ts>(ts)...);
			buffer << '\n';
		}
	}